

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

void __thiscall CVmObjDate::save_to_file(CVmObjDate *this,CVmFile *fp)

{
  int *piVar1;
  
  piVar1 = (int *)(this->super_CVmObject).ext_;
  CVmFile::write_int4(fp,*piVar1);
  CVmFile::write_uint4(fp,piVar1[1]);
  return;
}

Assistant:

void CVmObjDate::save_to_file(VMG_ class CVmFile *fp)
{
    /* get our extension */
    vm_date_ext *ext = get_ext();

    /* write the extension data */
    fp->write_int4(ext->dayno);
    fp->write_uint4(ext->daytime);
}